

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void add_objunit(GlobalVars *gv,ObjectUnit *ou,bool fixrelocs)

{
  char *pcVar1;
  uint uVar2;
  Section *pSVar3;
  char *pcVar4;
  int in_EDX;
  ObjectUnit *in_RSI;
  long in_RDI;
  uint32_t idx;
  Reloc *r;
  Section *sec;
  uint8_t t;
  ObjectUnit *obj;
  node *local_28;
  node *local_20;
  byte local_15;
  
  if (in_RSI != (ObjectUnit *)0x0) {
    local_15 = in_RSI->lnkfile->type;
    if ((local_15 == 8) && (*(int *)(in_RDI + 0x74) != 0)) {
      local_15 = 1;
    }
    uVar2 = (uint)local_15;
    if (uVar2 - 1 < 2) {
      in_RSI->flags = in_RSI->flags | 1;
      addtail((list *)(in_RDI + 0x150),&in_RSI->n);
    }
    else if (uVar2 == 4) {
      addtail((list *)(in_RDI + 0x180),&in_RSI->n);
    }
    else if (uVar2 == 8) {
      addtail((list *)(in_RDI + 0x168),&in_RSI->n);
    }
    else {
      ierror("add_objunit(): Link File type = %d",(ulong)in_RSI->lnkfile->type);
    }
    if (in_EDX != 0) {
      for (local_20 = (in_RSI->sections).first; local_20->next != (node *)0x0;
          local_20 = local_20->next) {
        for (local_28 = local_20[6].next; local_28->next != (node *)0x0; local_28 = local_28->next)
        {
          uVar2 = *(uint *)&local_28[1].pred;
          pSVar3 = find_sect_id(in_RSI,uVar2);
          local_28[1].pred = &pSVar3->n;
          if (pSVar3 == (Section *)0x0) {
            pcVar1 = in_RSI->lnkfile->pathname;
            obj = (ObjectUnit *)local_20[2].next;
            pcVar4 = getobjname(obj);
            error(0x34,pcVar1,obj,pcVar4,(ulong)uVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void add_objunit(struct GlobalVars *gv,struct ObjectUnit *ou,bool fixrelocs)
/* adds an ObjectUnit to the approriate list */
{
  if (ou) {
    uint8_t t = ou->lnkfile->type;

    if (t==ID_LIBARCH && gv->whole_archive)
      t = ID_OBJECT;  /* force linking of a whole archive */

    switch (t) {
      case ID_OBJECT:
      case ID_EXECUTABLE:
        ou->flags |= OUF_LINKED;  /* objects are always linked */
        addtail(&gv->selobjects,&ou->n);
        break;
      case ID_LIBARCH:
        addtail(&gv->libobjects,&ou->n);
        break;
      case ID_SHAREDOBJ:
        addtail(&gv->sharedobjects,&ou->n);
        break;
      default:
        ierror("add_objunit(): Link File type = %d",
               (int)ou->lnkfile->type);
    }

    if (fixrelocs) {  /* convert section index into address */
      struct Section *sec;
      struct Reloc *r;
      uint32_t idx;

      for (sec=(struct Section *)ou->sections.first;
           sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
        for (r=(struct Reloc *)sec->relocs.first;
             r->n.next!=NULL; r=(struct Reloc *)r->n.next) {
          idx = r->relocsect.id;
          if ((r->relocsect.ptr = find_sect_id(ou,idx)) == NULL) {
            /* section with this index doesn't exist */
            error(52,ou->lnkfile->pathname,sec->name,getobjname(ou),(int)idx);
          }
        }
      }
    }
  }
}